

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

void fielddesc_setfloat_var(_fielddesc *fd,t_symbol *s)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *__s;
  t_symbol *ptVar4;
  char *pcVar5;
  double quantum;
  double screen2;
  double screen1;
  double v2;
  double v1;
  char strbuf [1000];
  double local_450;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  double local_438;
  double local_430;
  double local_428;
  double local_420;
  char local_418 [1000];
  
  fd->fd_type = '\x01';
  fd->fd_var = '\x01';
  pcVar5 = s->s_name;
  pcVar3 = strchr(pcVar5,0x28);
  if ((pcVar3 == (char *)0x0) || (__s = strchr(pcVar5,0x29), __s < pcVar3)) {
    (fd->fd_un).fd_symbol = s;
    fd->fd_v1 = 0.0;
    fd->fd_v2 = 0.0;
    fd->fd_screen1 = 0.0;
    fd->fd_screen2 = 0.0;
LAB_0015cde1:
    fd->fd_quantum = 0.0;
  }
  else {
    iVar1 = (int)pcVar3 - (int)pcVar5;
    if (0x3e2 < iVar1) {
      iVar1 = 0x3e3;
    }
    strncpy(local_418,pcVar5,(long)iVar1);
    local_418[iVar1] = '\0';
    ptVar4 = gensym(local_418);
    (fd->fd_un).fd_symbol = ptVar4;
    uVar2 = __isoc99_sscanf(pcVar3,"(%lf:%lf)(%lf:%lf)(%lf)",&local_420,&local_428,&local_430,
                            &local_438,&local_450);
    fStack_440 = (float)local_430;
    fStack_43c = (float)local_438;
    local_448 = (float)local_420;
    fStack_444 = (float)local_428;
    fd->fd_v1 = local_448;
    fd->fd_v2 = fStack_444;
    fd->fd_screen1 = fStack_440;
    fd->fd_screen2 = fStack_43c;
    fd->fd_quantum = (float)local_450;
    if (uVar2 != 3 && 1 < (int)uVar2) {
      if (uVar2 < 4) {
        pcVar5 = strchr(__s,0x28);
        if (pcVar5 != (char *)0x0) goto LAB_0015cefc;
      }
      else if (uVar2 != 4) {
        return;
      }
      pcVar5 = strchr(__s,0x28);
      if ((pcVar5 == (char *)0x0) || (pcVar5 = strchr(pcVar5 + 1,0x28), pcVar5 == (char *)0x0)) {
        if (uVar2 == 2) {
          fd->fd_quantum = 0.0;
          fd->fd_screen1 = local_448;
          fd->fd_screen2 = fStack_444;
          return;
        }
        if (uVar2 != 4) {
          return;
        }
        goto LAB_0015cde1;
      }
    }
LAB_0015cefc:
    post("parse error: %s",s->s_name);
    fd->fd_v1 = 0.0;
    fd->fd_v2 = 0.0;
    fd->fd_screen1 = 0.0;
    fd->fd_screen2 = 0.0;
    fd->fd_quantum = 0.0;
  }
  return;
}

Assistant:

static void fielddesc_setfloat_var(t_fielddesc *fd, t_symbol *s)
{
    char *s1, *s2, *s3, strbuf[MAXPDSTRING];
    int i;
    fd->fd_type = A_FLOAT;
    fd->fd_var = 1;
    if (!(s1 = strchr(s->s_name, '(')) || !(s2 = strchr(s->s_name, ')'))
        || (s1 > s2))
    {
        fd->fd_un.fd_varsym = s;
        fd->fd_v1 = fd->fd_v2 = fd->fd_screen1 = fd->fd_screen2 =
            fd->fd_quantum = 0;
    }
    else
    {
        int cpy = (int)(s1 - s->s_name), got;
        double v1, v2, screen1, screen2, quantum;
        if (cpy > MAXPDSTRING-5)
            cpy = MAXPDSTRING-5;
        strncpy(strbuf, s->s_name, cpy);
        strbuf[cpy] = 0;
        fd->fd_un.fd_varsym = gensym(strbuf);
        got = sscanf(s1, "(%lf:%lf)(%lf:%lf)(%lf)",
            &v1, &v2, &screen1, &screen2,
                &quantum);
        fd->fd_v1=v1;
        fd->fd_v2=v2;
        fd->fd_screen1=screen1;
        fd->fd_screen2=screen2;
        fd->fd_quantum=quantum;
        if (got < 2)
            goto fail;
        if (got == 3 || (got < 4 && strchr(s2, '(')))
            goto fail;
        if (got < 5 && (s3 = strchr(s2, '(')) && strchr(s3+1, '('))
            goto fail;
        if (got == 4)
            fd->fd_quantum = 0;
        else if (got == 2)
        {
            fd->fd_quantum = 0;
            fd->fd_screen1 = fd->fd_v1;
            fd->fd_screen2 = fd->fd_v2;
        }
        return;
    fail:
        post("parse error: %s", s->s_name);
        fd->fd_v1 = fd->fd_screen1 = fd->fd_v2 = fd->fd_screen2 =
            fd->fd_quantum = 0;
    }
}